

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH64_hash_t
XXH3_hashLong_64b_withSeed(void *input,size_t len,XXH64_hash_t seed,xxh_u8 *secret,size_t secretLen)

{
  XXH64_hash_t XVar1;
  XXH3_f_scrambleAcc in_R9;
  xxh_u8 secret_1 [192];
  undefined1 auStack_d8 [192];
  
  if (seed != 0) {
    XXH3_initCustomSecret_sse2(auStack_d8,seed);
    XVar1 = XXH3_hashLong_64b_internal
                      (input,len,auStack_d8,0xc0,(XXH3_f_accumulate_512)secretLen,in_R9);
    return XVar1;
  }
  XVar1 = XXH3_hashLong_64b_internal
                    (input,len,XXH3_kSecret,0xc0,(XXH3_f_accumulate_512)secretLen,in_R9);
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t XXH3_hashLong_64b_withSeed(const void* input,
                                                      size_t len,
                                                      XXH64_hash_t seed,
                                                      const xxh_u8* secret,
                                                      size_t secretLen) {
  (void)secret;
  (void)secretLen;
  return XXH3_hashLong_64b_withSeed_internal(
      input, len, seed, XXH3_accumulate_512, XXH3_scrambleAcc,
      XXH3_initCustomSecret);
}